

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deflate.c
# Opt level: O0

double ZopfliCalculateBlockSizeAutoType(ZopfliLZ77Store *lz77,size_t lstart,size_t lend)

{
  long in_RDI;
  double dyncost;
  double fixedcost;
  double uncompressedcost;
  int in_stack_000004f4;
  size_t in_stack_000004f8;
  size_t in_stack_00000500;
  ZopfliLZ77Store *in_stack_00000508;
  double local_48;
  double local_40;
  double local_38;
  
  local_40 = ZopfliCalculateBlockSize
                       (in_stack_00000508,in_stack_00000500,in_stack_000004f8,in_stack_000004f4);
  local_38 = local_40;
  if (*(ulong *)(in_RDI + 0x10) < 0x3e9) {
    local_38 = ZopfliCalculateBlockSize
                         (in_stack_00000508,in_stack_00000500,in_stack_000004f8,in_stack_000004f4);
  }
  local_48 = ZopfliCalculateBlockSize
                       (in_stack_00000508,in_stack_00000500,in_stack_000004f8,in_stack_000004f4);
  if ((local_38 <= local_40) || (local_48 <= local_40)) {
    if (local_38 < local_48) {
      local_48 = local_38;
    }
    local_40 = local_48;
  }
  return local_40;
}

Assistant:

double ZopfliCalculateBlockSizeAutoType(const ZopfliLZ77Store* lz77,
                                        size_t lstart, size_t lend) {
  double uncompressedcost = ZopfliCalculateBlockSize(lz77, lstart, lend, 0);
  /* Don't do the expensive fixed cost calculation for larger blocks that are
     unlikely to use it. */
  double fixedcost = (lz77->size > 1000) ?
      uncompressedcost : ZopfliCalculateBlockSize(lz77, lstart, lend, 1);
  double dyncost = ZopfliCalculateBlockSize(lz77, lstart, lend, 2);
  return (uncompressedcost < fixedcost && uncompressedcost < dyncost)
      ? uncompressedcost
      : (fixedcost < dyncost ? fixedcost : dyncost);
}